

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::char_spec_handler::on_char(char_spec_handler *this)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  size_t in_RCX;
  void *in_RDX;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_RDI;
  undefined8 in_stack_fffffffffffffff0;
  
  if ((in_RDI.container)->_vptr_buffer[2] == (_func_int *)0x0) {
    arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
    ::write((arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
             *)(in_RDI.container)->_vptr_buffer,(int)*(char *)&(in_RDI.container)->ptr_,in_RDX,
            in_RCX);
  }
  else {
    bVar1 = write_char<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (in_RDI,(char)((ulong)in_stack_fffffffffffffff0 >> 0x38),
                       (basic_format_specs<char> *)*(in_RDI.container)->_vptr_buffer);
    *(in_RDI.container)->_vptr_buffer = (_func_int *)bVar1.container;
  }
  return;
}

Assistant:

void on_char() {
      if (formatter.specs_)
        formatter.out_ = write_char(formatter.out_, value, *formatter.specs_);
      else
        formatter.write(value);
    }